

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O3

void __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::basic_socket<asio::io_context>
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this,io_context *context,
          endpoint_type *endpoint,
          constraint_t<is_convertible<io_context_&,_execution_context_&>::value> param_3)

{
  implementation_type *impl;
  service_type *psVar1;
  int af;
  error_code __ec;
  error_code __ec_00;
  error_code eVar2;
  error_code ec;
  system_error e;
  error_code local_60;
  key local_50 [2];
  
  local_50[0].type_info_ =
       (type_info *)
       &detail::typeid_wrapper<asio::detail::reactive_socket_service<asio::ip::udp>>::typeinfo;
  local_50[0].id_ = (id *)0x0;
  psVar1 = (service_type *)
           detail::service_registry::do_use_service
                     ((context->super_execution_context).service_registry_,local_50,
                      detail::service_registry::
                      create<asio::detail::reactive_socket_service<asio::ip::udp>,asio::io_context>,
                      context);
  (this->impl_).service_ = psVar1;
  impl = &(this->impl_).implementation_;
  (this->impl_).implementation_.protocol_.family_ = 2;
  (this->impl_).executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.target_fns_ =
       (target_fns *)
       execution::detail::any_executor_base::
       target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(bool,std::enable_if<!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value,void>::type*)
       ::fns_with_execute;
  (this->impl_).executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.object_fns_ =
       (object_fns *)
       execution::detail::any_executor_base::
       object_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(std::enable_if<(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value)&&(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,asio::execution::detail::shared_target_executor>::value),void>::type*)
       ::fns;
  *(io_context **)
   (this->impl_).executor_.
   super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
   .super_any_executor_base.object_.data = context;
  (this->impl_).executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.target_ = &(this->impl_).executor_;
  (this->impl_).executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .prop_fns_ = (prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)execution::
                  any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
                  ::
                  prop_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>()
                  ::fns;
  (this->impl_).implementation_.super_base_implementation_type.socket_ = -1;
  (this->impl_).implementation_.super_base_implementation_type.state_ = '\0';
  (this->impl_).implementation_.super_base_implementation_type.reactor_data_ =
       (per_descriptor_data)0x0;
  local_60._M_value = 0;
  local_60._M_cat = (error_category *)std::_V2::system_category();
  af = (uint)((endpoint->impl_).data_.base.sa_family != 2) * 8 + 2;
  eVar2 = detail::reactive_socket_service_base::do_open
                    (&psVar1->super_reactive_socket_service_base,
                     &impl->super_base_implementation_type,af,2,0x11,&local_60);
  if (eVar2._M_value == 0) {
    (this->impl_).implementation_.protocol_.family_ = af;
  }
  __ec._4_4_ = 0;
  __ec._M_value = local_60._M_value;
  if (local_60._M_value != 0) {
    __ec._M_cat = local_60._M_cat;
    std::system_error::system_error((system_error *)local_50,__ec,"open");
    detail::throw_exception<std::system_error>((system_error *)local_50);
    std::system_error::~system_error((system_error *)local_50);
  }
  detail::reactive_socket_service<asio::ip::udp>::bind
            ((this->impl_).service_,(int)impl,(sockaddr *)endpoint,(socklen_t)&local_60);
  __ec_00._4_4_ = 0;
  __ec_00._M_value = local_60._M_value;
  if (local_60._M_value != 0) {
    __ec_00._M_cat = local_60._M_cat;
    std::system_error::system_error((system_error *)local_50,__ec_00,"bind");
    detail::throw_exception<std::system_error>((system_error *)local_50);
    std::system_error::~system_error((system_error *)local_50);
  }
  return;
}

Assistant:

basic_socket(ExecutionContext& context, const endpoint_type& endpoint,
      constraint_t<
        is_convertible<ExecutionContext&, execution_context&>::value
      > = 0)
    : impl_(0, 0, context)
  {
    asio::error_code ec;
    const protocol_type protocol = endpoint.protocol();
    impl_.get_service().open(impl_.get_implementation(), protocol, ec);
    asio::detail::throw_error(ec, "open");
    impl_.get_service().bind(impl_.get_implementation(), endpoint, ec);
    asio::detail::throw_error(ec, "bind");
  }